

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

Problem * doProving(Problem *problem)

{
  Mode MVar1;
  ulong uVar2;
  Problem *pPVar3;
  Options *in_stack_00000008;
  Options *in_stack_00000010;
  Problem *prb;
  Options *in_stack_00000028;
  bool in_stack_00000047;
  Options *in_stack_00000048;
  string *in_stack_00003348;
  Options *in_stack_00003350;
  Problem *in_stack_fffffffffffffff0;
  
  Shell::Options::strategySamplerFilename_abi_cxx11_(Lib::env);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Shell::Options::strategySamplerFilename_abi_cxx11_(Lib::env);
    Shell::Options::sampleStrategy(in_stack_00003350,in_stack_00003348);
  }
  Shell::Options::setForcedOptionValues(in_stack_00000010);
  Shell::Options::checkGlobalOptionConstraints(in_stack_00000048,in_stack_00000047);
  pPVar3 = preprocessProblem(in_stack_fffffffffffffff0);
  MVar1 = Shell::Options::mode(Lib::env);
  if (MVar1 != SPIDER) {
    Kernel::Problem::getProperty((Problem *)Lib::env);
    Shell::Options::checkProblemOptionConstraints
              (in_stack_00000028,(Property *)problem,prb._7_1_,prb._6_1_);
  }
  Saturation::ProvingHelper::runVampireSaturation((Problem *)in_stack_00000010,in_stack_00000008);
  return pPVar3;
}

Assistant:

[[nodiscard]]
Problem *doProving(Problem* problem)
{
  // a new strategy randomization mechanism
  if (!env.options->strategySamplerFilename().empty()) {
    env.options->sampleStrategy(env.options->strategySamplerFilename());
  }

  env.options->setForcedOptionValues();
  env.options->checkGlobalOptionConstraints();

  Problem *prb = preprocessProblem(problem);

  // this will provide warning if options don't make sense for problem
  if (env.options->mode()!=Options::Mode::SPIDER) {
    env.options->checkProblemOptionConstraints(prb->getProperty(), /*before_preprocessing = */ false);
  }

  ProvingHelper::runVampireSaturation(*prb, *env.options);
  return prb;
}